

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O3

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s1;
  cmMakefile *pcVar2;
  cmCommand *this_00;
  bool bVar3;
  int iVar4;
  CacheEntryType CVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  cmState *this_01;
  uint uVar9;
  bool bVar10;
  pointer pbVar11;
  pointer pbVar12;
  long lVar13;
  pointer pcVar14;
  bool bVar15;
  string currValue;
  string value;
  uint local_98;
  string local_90;
  string local_70;
  CacheEntryType local_4c;
  cmCommand *local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 == pbVar12) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  __s1 = (pbVar11->_M_dataplus)._M_p;
  iVar4 = strncmp(__s1,"ENV{",4);
  if ((iVar4 != 0) || (sVar6 = strlen(__s1), sVar6 < 6)) {
    uVar8 = (long)pbVar12 - (long)pbVar11;
    if ((long)uVar8 >> 5 == 2) {
      iVar4 = std::__cxx11::string::compare((char *)((long)pbVar11 + (uVar8 - 0x20)));
      if (iVar4 != 0) {
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar12 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar8 = (long)pbVar12 - (long)pbVar11;
        goto LAB_00364a64;
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_70,__s1,(allocator *)&local_90);
      cmMakefile::RaiseScope(pcVar2,&local_70,(char *)0x0);
    }
    else {
      if ((long)uVar8 >> 5 != 1) {
LAB_00364a64:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_48 = &this->super_cmCommand;
        if (uVar8 < 0x21) {
LAB_00364af2:
          local_98 = 0;
LAB_00364af5:
          if ((ulong)((long)uVar8 >> 5) < 4) {
            bVar15 = false;
            bVar3 = false;
            uVar9 = local_98;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)(pbVar11 + (((long)uVar8 >> 5) - (ulong)(byte)local_98) + -3)
                              );
            bVar15 = iVar4 == 0;
            uVar9 = local_98 + 3;
            if (!bVar15) {
              uVar9 = local_98;
            }
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar12 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            bVar3 = false;
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&pbVar11[-1]._M_dataplus._M_p + uVar8));
          local_98 = 0;
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4 != 0) {
            uVar8 = (long)pbVar12 - (long)pbVar11;
            if (uVar8 < 0x81) goto LAB_00364af2;
            iVar4 = std::__cxx11::string::compare((char *)((long)pbVar11 + (uVar8 - 0x20)));
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar12 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            uVar8 = (long)pbVar12 - (long)pbVar11;
            local_98 = (uint)(iVar4 == 0);
            goto LAB_00364af5;
          }
          uVar9 = 1;
          bVar3 = true;
          bVar15 = false;
        }
        local_40.Begin._M_current = pbVar11 + 1;
        local_40.End._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)pbVar12 - (ulong)(uVar9 << 5));
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_90,&local_40,";");
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        paVar1 = &local_90.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        if (bVar3) {
          pcVar2 = local_48->Makefile;
          std::__cxx11::string::string((string *)&local_90,__s1,(allocator *)&local_40);
          cmMakefile::RaiseScope(pcVar2,&local_90,local_70._M_dataplus._M_p);
joined_r0x00364ec9:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          bVar10 = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + -1));
          this_00 = local_48;
          if (iVar4 != 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
            if (((uVar8 < 0x21) ||
                (iVar4 = std::__cxx11::string::compare((char *)((long)pbVar11 + (uVar8 - 0x40))),
                iVar4 != 0)) && (bVar3 = SUB41(local_98,0), bVar3 != true || bVar15)) {
              if (bVar15) {
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar13 = ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) -
                         (ulong)bVar3;
                local_4c = cmState::StringToCacheEntryType(pbVar11[lVar13 + -2]._M_dataplus._M_p);
                pcVar14 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar13 + -1]._M_dataplus._M_p;
              }
              else {
                local_4c = STRING;
                pcVar14 = (char *)0x0;
              }
              this_01 = cmMakefile::GetState(this_00->Makefile);
              std::__cxx11::string::string((string *)&local_90,__s1,(allocator *)&local_40);
              pcVar7 = cmState::GetCacheEntryValue(this_01,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != paVar1) {
                operator_delete(local_90._M_dataplus._M_p,
                                CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                         local_90.field_2._M_local_buf[0]) + 1);
              }
              if (pcVar7 != (char *)0x0) {
                std::__cxx11::string::string((string *)&local_90,__s1,(allocator *)&local_40);
                CVar5 = cmState::GetCacheEntryType(this_01,&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != paVar1) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                           local_90.field_2._M_local_buf[0]) + 1);
                }
                if ((bVar3 == false) &&
                   (bVar10 = true, (bool)(local_4c != INTERNAL & bVar15 & CVar5 != UNINITIALIZED)))
                goto LAB_00364d34;
              }
              pcVar2 = this_00->Makefile;
              if (bVar15) {
                std::__cxx11::string::string((string *)&local_90,__s1,(allocator *)&local_40);
                cmMakefile::AddCacheDefinition
                          (pcVar2,&local_90,local_70._M_dataplus._M_p,pcVar14,local_4c,bVar3);
              }
              else {
                std::__cxx11::string::string((string *)&local_90,__s1,(allocator *)&local_40);
                cmMakefile::AddDefinition(pcVar2,&local_90,local_70._M_dataplus._M_p);
              }
              goto joined_r0x00364ec9;
            }
          }
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"given invalid arguments for CACHE mode.","");
          cmCommand::SetError(this_00,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          bVar10 = false;
        }
LAB_00364d34:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
          return bVar10;
        }
        return bVar10;
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_70,__s1,(allocator *)&local_90);
      cmMakefile::RemoveDefinition(pcVar2,&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return true;
    }
    goto LAB_00364b8a;
  }
  pcVar7 = (char *)operator_new__(sVar6);
  sVar6 = strlen(__s1);
  strncpy(pcVar7,__s1 + 4,sVar6 - 5);
  sVar6 = strlen(__s1);
  pcVar7[sVar6 - 5] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar6 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar7,pcVar7 + sVar6);
  std::__cxx11::string::append((char *)&local_70);
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar3 = cmsys::SystemTools::GetEnv(pcVar7,&local_90);
  operator_delete__(pcVar7);
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x21) ||
     (sVar6 = pbVar11[1]._M_string_length, sVar6 == 0)) {
    if (bVar3) goto LAB_00364d76;
  }
  else {
    if (bVar3) {
      pcVar14 = pbVar11[1]._M_dataplus._M_p;
      if ((local_90._M_string_length == sVar6) &&
         (iVar4 = bcmp(local_90._M_dataplus._M_p,pcVar14,sVar6), iVar4 == 0)) goto LAB_00364d80;
    }
    else {
      pcVar14 = pbVar11[1]._M_dataplus._M_p;
    }
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)pcVar14);
LAB_00364d76:
    cmsys::SystemTools::PutEnv(&local_70);
  }
LAB_00364d80:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return true;
  }
LAB_00364b8a:
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                           local_70.field_2._M_local_buf[0]) + 1);
  return true;
}

Assistant:

bool cmSetCommand::InitialPass(std::vector<std::string> const& args,
                               cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5) {
    // what is the variable name
    char* varName = new char[strlen(variable)];
    strncpy(varName, variable + 4, strlen(variable) - 5);
    varName[strlen(variable) - 5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);
    delete[] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args[args.size() - 1] == "PARENT_SCOPE") {
    this->Makefile->RaiseScope(variable, CM_NULLPTR);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;             // required if cache
  const char* docstring = CM_NULLPTR; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size() - 1] == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size() - 1] == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart + 1].c_str());
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    this->Makefile->AddCacheDefinition(variable, value.c_str(), docstring,
                                       type, force);
  } else {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
  }
  return true;
}